

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderIndexingTests.cpp
# Opt level: O2

ShaderEvalFunc deqp::gles3::Functional::getArrayCoordsEvalFunc(DataType dataType)

{
  if (dataType - TYPE_FLOAT < 4) {
    return (ShaderEvalFunc)(&PTR_evalArrayCoordsFloat_00c0d0e0)[dataType - TYPE_FLOAT];
  }
  return (ShaderEvalFunc)0x0;
}

Assistant:

static ShaderEvalFunc getArrayCoordsEvalFunc (DataType dataType)
{
	if (dataType == TYPE_FLOAT)				return evalArrayCoordsFloat;
	else if (dataType == TYPE_FLOAT_VEC2)	return evalArrayCoordsVec2;
	else if (dataType == TYPE_FLOAT_VEC3)	return evalArrayCoordsVec3;
	else if (dataType == TYPE_FLOAT_VEC4)	return evalArrayCoordsVec4;

	DE_FATAL("Invalid data type.");
	return NULL;
}